

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_static_analyzer.cpp
# Opt level: O2

bool __thiscall Analyzer::isVariableTestedBefore(Analyzer *this,Node *variable)

{
  NodeType NVar1;
  Node *pNVar2;
  Node *node;
  bool bVar3;
  pointer ppNVar4;
  Node *pNVar5;
  long lVar6;
  
  ppNVar4 = (this->nodePath).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  lVar6 = (long)(this->nodePath).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)ppNVar4 >> 3;
  pNVar2 = (Node *)0x0;
  while( true ) {
    pNVar5 = pNVar2;
    lVar6 = lVar6 + -1;
    pNVar2 = ppNVar4[lVar6];
    if (pNVar2 == (Node *)0x0) break;
    NVar1 = pNVar2->nodeType;
    if ((((NVar1 - PNT_IF_ELSE < 2) || (NVar1 == PNT_TERNARY_OP)) ||
        ((NVar1 == PNT_BINARY_OP && (pNVar2->tok->type - TK_AND < 2)))) &&
       (node = *(pNVar2->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_start, node != pNVar5)) {
      bVar3 = isSubnodeExistsInNode(this,node,variable);
      if (bVar3) break;
      ppNVar4 = (this->nodePath).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      pNVar2 = ppNVar4[lVar6];
    }
  }
  return pNVar2 != (Node *)0x0;
}

Assistant:

bool isVariableTestedBefore(Node * variable)
  {
    Node * nextNode = nullptr;
    for (size_t i = nodePath.size() - 1; nodePath[i] != nullptr; nextNode = nodePath[i], i--)
    {
      if (nodePath[i]->nodeType == PNT_IF_ELSE || nodePath[i]->nodeType == PNT_TERNARY_OP ||
        nodePath[i]->nodeType == PNT_WHILE_LOOP ||
        (nodePath[i]->nodeType == PNT_BINARY_OP && (nodePath[i]->tok.type == TK_AND || nodePath[i]->tok.type == TK_OR)))
      {
        Node * condition = nodePath[i]->children[0];
        if (condition != nextNode && isSubnodeExistsInNode(condition, variable))
          return true;
      }
    }

    return false;
  }